

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::runInternal(Session *this)

{
  size_type *psVar1;
  const_iterator __position;
  pointer this_00;
  TestCase **ppTVar2;
  pointer pcVar3;
  pointer pTVar4;
  ListeningReporter *this_01;
  undefined8 uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar9;
  undefined4 extraout_var;
  long *plVar10;
  long lVar11;
  pointer pbVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Base_ptr p_Var13;
  char *pcVar14;
  ostream *poVar15;
  int iVar16;
  const_iterator __begin3;
  element_type *peVar17;
  pointer pcVar18;
  TestCase **__v;
  long lVar19;
  undefined8 *puVar20;
  FilterMatch *match;
  pointer pTVar21;
  pointer *__x;
  undefined1 auVar22 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  TestGroup tests;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_330;
  element_type *local_328;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_320;
  ListeningReporter *local_318;
  vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
  *local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [48];
  undefined1 local_2c8 [48];
  pointer pbStack_298;
  pointer local_290;
  pointer local_288;
  pointer local_280;
  undefined1 local_278 [240];
  long *local_188;
  ulong local_168;
  long *local_140;
  undefined1 local_78 [64];
  _Alloc_hider _Stack_38;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  lVar19 = 0;
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  config(this);
  seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_IConfig);
  local_288 = (pointer)&this->m_config;
  if ((this->m_configData).filenamesAsTags == true) {
    peVar17 = (((shared_ptr<Catch::Config> *)local_288)->
              super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pSVar9 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar7 = (*(pSVar9->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar9);
    plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x18))
                                ((long *)CONCAT44(extraout_var,iVar7),peVar17);
    lVar19 = plVar10[1];
    if (*plVar10 != lVar19) {
      __x = (pointer *)(*plVar10 + 0x60);
      do {
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_308,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__x);
        std::__cxx11::string::string
                  ((string *)local_278,
                   (char *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(__x + 6))->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,(allocator *)&local_330);
        lVar11 = std::__cxx11::string::find_last_of((char *)local_278,0x16e6c0,0xffffffffffffffff);
        if (lVar11 == -1) {
          std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0x16ca51);
        }
        else {
          std::__cxx11::string::erase((ulong)local_278,0);
          *(char *)local_278._0_8_ = '#';
        }
        pbVar12 = (pointer)std::__cxx11::string::rfind
                                     ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_278,0x2e);
        if (pbVar12 != (pointer)0xffffffffffffffff) {
          if ((ulong)local_278._8_8_ < pbVar12) {
            auVar22 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",pbVar12);
            if ((element_type *)local_308._8_8_ != (element_type *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
            }
            if ((pointer)local_2c8._8_8_ != (pointer)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
            }
            if ((pointer)local_278._8_8_ != (pointer)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
            }
            if (auVar22._8_4_ == 1) {
              plVar10 = (long *)__cxa_begin_catch(auVar22._0_8_);
              pcVar14 = (char *)(**(code **)(*plVar10 + 0x10))(plVar10);
              poVar15 = std::operator<<((ostream *)&std::cerr,pcVar14);
              std::endl<char,std::char_traits<char>>(poVar15);
              __cxa_end_catch();
              return 0xff;
            }
            _Unwind_Resume(auVar22._0_8_);
          }
          *(char *)(local_278._0_8_ + (long)pbVar12) = '\0';
          local_278._8_8_ = pbVar12;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2c8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_308);
        setTags((TestCaseInfo *)(__x + -0xc),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c8);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2c8);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_308);
        lVar11 = (long)(__x + 0xb);
        __x = __x + 0x17;
      } while (lVar11 != lVar19);
    }
  }
  list((Catch *)local_278,(shared_ptr<Catch::Config> *)local_288);
  iVar7 = (int)lVar19;
  if ((int *)local_278._0_8_ != (int *)0x0) {
    iVar7 = 0xff;
    if (*(int *)local_278._0_8_ < 0xff) {
      iVar7 = *(int *)local_278._0_8_;
    }
  }
  if ((int *)local_278._0_8_ != (int *)0x0) {
    return iVar7;
  }
  local_278._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._8_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((pointer)local_278._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((pointer)local_278._8_8_)->_M_string_length =
           (int)((pointer)local_278._8_8_)->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&((pointer)local_278._8_8_)->_M_string_length =
           (int)((pointer)local_278._8_8_)->_M_string_length + 1;
    }
  }
  local_2c8._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2c8._8_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((element_type *)local_2c8._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((element_type *)local_2c8._8_8_)->m_data =
           *(int *)&((element_type *)local_2c8._8_8_)->m_data + 1;
      UNLOCK();
    }
    else {
      *(int *)&((element_type *)local_2c8._8_8_)->m_data =
           *(int *)&((element_type *)local_2c8._8_8_)->m_data + 1;
    }
  }
  pSVar9 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar7 = (*(pSVar9->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar9);
  plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar7));
  if (*plVar10 == plVar10[1]) {
    local_308._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_308._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_320,
               &(((element_type *)local_308._0_8_)->m_data).reporterName,(IConfigPtr *)local_308);
  }
  else {
    local_320._M_head_impl = (IStreamingReporter *)operator_new(0x30);
    (((ListeningReporter *)local_320._M_head_impl)->super_IStreamingReporter).
    _vptr_IStreamingReporter = (_func_int **)&PTR__ListeningReporter_001946c0;
    (((ListeningReporter *)local_320._M_head_impl)->m_listeners).
    super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((ListeningReporter *)local_320._M_head_impl)->m_listeners).
    super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((ListeningReporter *)local_320._M_head_impl)->m_listeners).
    super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((ListeningReporter *)local_320._M_head_impl)->m_reporter)._M_t.
    super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
    ._M_t.
    super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
    .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
         (IStreamingReporter *)0x0;
    (((ListeningReporter *)local_320._M_head_impl)->m_preferences).shouldRedirectStdOut = false;
    (((ListeningReporter *)local_320._M_head_impl)->m_preferences).shouldReportAllAssertions = true;
    local_318 = (ListeningReporter *)local_320._M_head_impl;
    pSVar9 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar7 = (*(pSVar9->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar9);
    plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x20))
                                ((long *)CONCAT44(extraout_var_01,iVar7));
    puVar20 = (undefined8 *)*plVar10;
    local_328 = (element_type *)plVar10[1];
    if ((element_type *)puVar20 != local_328) {
      local_310 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                   *)&local_318->m_listeners;
      do {
        plVar10 = (long *)*puVar20;
        peVar17 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        this_00 = (pointer)(this->m_config).
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
        if (this_00 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        iVar7 = (*(peVar17->super_IConfig).super_NonCopyable._vptr_NonCopyable[3])(peVar17);
        local_308._0_8_ = CONCAT44(extraout_var_02,iVar7);
        if (this_00 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(this_00->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_308._8_8_ = peVar17;
        local_2f8._0_8_ = this_00;
        (**(code **)(*plVar10 + 0x10))(&local_330,plVar10,local_308);
        std::
        vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
        ::
        emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                  (local_310,
                   (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)&local_330);
        if (local_330._M_head_impl != (IStreamingReporter *)0x0) {
          (*(local_330._M_head_impl)->_vptr_IStreamingReporter[1])();
        }
        local_330._M_head_impl = (IStreamingReporter *)0x0;
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._0_8_);
        }
        if (this_00 != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        puVar20 = puVar20 + 2;
      } while ((element_type *)puVar20 != local_328);
    }
    this_01 = local_318;
    local_308._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_308._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_330,
               &(((element_type *)local_308._0_8_)->m_data).reporterName,(IConfigPtr *)local_308);
    ListeningReporter::addReporter(this_01,(IStreamingReporterPtr *)&local_330);
    if (local_330._M_head_impl != (IStreamingReporter *)0x0) {
      (*(local_330._M_head_impl)->_vptr_IStreamingReporter[1])();
    }
    local_330._M_head_impl = (IStreamingReporter *)0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
  }
  RunContext::RunContext
            ((RunContext *)(local_278 + 0x10),(IConfigPtr *)local_2c8,
             (IStreamingReporterPtr *)&local_320);
  if ((ListeningReporter *)local_320._M_head_impl != (ListeningReporter *)0x0) {
    (*((IStreamingReporter *)&(local_320._M_head_impl)->_vptr_IStreamingReporter)->
      _vptr_IStreamingReporter[1])();
  }
  if ((element_type *)local_2c8._8_8_ != (element_type *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
  }
  uVar5 = local_278._0_8_;
  __position._M_node = (_Base_ptr)(local_78 + 8);
  local_78._8_4_ = 0;
  local_78._16_8_ = 0;
  local_78._40_8_ = 0;
  local_78._48_8_ = (pointer)0x0;
  local_78._56_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_38._M_p = (pointer)0x0;
  local_78._24_8_ = __position._M_node;
  local_78._32_8_ = __position._M_node;
  pSVar9 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar7 = (*(pSVar9->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar9);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x18))
                        ((long *)CONCAT44(extraout_var_03,iVar7),uVar5);
  iVar7 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  TestSpec::matchesByFilter
            ((Matches *)local_2c8,(TestSpec *)CONCAT44(extraout_var_04,iVar7),testCases,
             (IConfig *)local_278._0_8_);
  local_2f8._0_8_ = _Stack_38._M_p;
  local_308._8_8_ = local_78._56_8_;
  local_308._0_8_ = local_78._48_8_;
  local_78._48_8_ = local_2c8._0_8_;
  local_78._56_8_ = local_2c8._8_8_;
  _Stack_38._M_p = (pointer)local_2c8._16_8_;
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_308);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_2c8);
  iVar7 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_328 = (element_type *)local_78._56_8_;
  if (local_78._48_8_ == local_78._56_8_) {
    if (*(long *)(CONCAT44(extraout_var_05,iVar7) + 0x18) ==
        *(long *)(CONCAT44(extraout_var_05,iVar7) + 0x20)) {
      pTVar21 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar21 != pTVar4) {
        do {
          if (((pTVar21->super_TestCaseInfo).properties & IsHidden) == None) {
            local_308._0_8_ = pTVar21;
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::_M_emplace_unique<Catch::TestCase_const*>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)local_78,(TestCase **)local_308);
          }
          pTVar21 = pTVar21 + 1;
        } while (pTVar21 != pTVar4);
      }
      goto LAB_00122bd5;
    }
    if (local_78._48_8_ == local_78._56_8_) goto LAB_00122bd5;
  }
  peVar17 = (element_type *)local_78._48_8_;
  do {
    ppTVar2 = (TestCase **)(peVar17->m_data).benchmarkConfidenceInterval;
    local_308._0_8_ = (pointer)local_78;
    for (__v = *(TestCase ***)&(peVar17->m_data).benchmarkSamples; __v != ppTVar2; __v = __v + 1) {
      std::
      _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
      ::
      _M_insert_unique_<Catch::TestCase_const*const&,std::_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>::_Alloc_node>
                ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                  *)local_78,__position,__v,(_Alloc_node *)local_308);
    }
    peVar17 = (element_type *)&(peVar17->m_data).benchmarkWarmupTime;
  } while (peVar17 != local_328);
LAB_00122bd5:
  iVar7 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffff00000000;
  local_2c8._8_8_ = (element_type *)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  local_2c8._24_8_ = (ListeningReporter *)0x0;
  local_2c8._32_8_ =
       (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
        *)0x0;
  local_2c8._40_8_ = 0;
  pbStack_298 = (pointer)0x0;
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_308);
  RunContext::testGroupStarting((RunContext *)(local_278 + 0x10),(string *)local_308,1,1);
  if ((pointer)local_308._0_8_ != (pointer)local_2f8) {
    operator_delete((void *)local_308._0_8_);
  }
  local_280 = (pointer)CONCAT44(extraout_var_06,iVar7);
  if ((_Base_ptr)local_78._24_8_ != __position._M_node) {
    local_328 = (element_type *)local_2c8._8_8_;
    local_290 = (pointer)local_2c8._16_8_;
    local_318 = (ListeningReporter *)local_2c8._24_8_;
    local_310 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                 *)local_2c8._32_8_;
    p_Var13 = (_Base_ptr)local_78._24_8_;
    pbVar12 = pbStack_298;
    lVar19 = local_2c8._40_8_;
    do {
      uVar6 = local_168;
      iVar7 = (**(code **)(*local_188 + 0x48))();
      if (uVar6 < (ulong)(long)iVar7) {
        RunContext::runTest((Totals *)local_308,(RunContext *)(local_278 + 0x10),
                            *(TestCase **)(p_Var13 + 1));
        local_328 = (element_type *)
                    ((long)&(local_328->super_IConfig).super_NonCopyable._vptr_NonCopyable +
                    local_308._8_8_);
        local_290 = (pointer)((long)&(local_290->name)._M_dataplus._M_p + local_2f8._0_8_);
        local_318 = (ListeningReporter *)
                    ((long)&(local_318->super_IStreamingReporter)._vptr_IStreamingReporter +
                    local_2f8._8_8_);
        local_310 = local_310 + local_2f8._16_8_;
        lVar19 = lVar19 + local_2f8._24_8_;
        pbVar12 = (pointer)((long)&(pbVar12->_M_dataplus)._M_p + local_2f8._32_8_);
      }
      else {
        (**(code **)(*local_140 + 0x78))(local_140,*(undefined8 *)(p_Var13 + 1));
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != __position._M_node);
    local_2c8._16_8_ = local_290;
    local_2c8._24_8_ = local_318;
    local_2c8._32_8_ = local_310;
    local_2c8._8_8_ = local_328;
    local_2c8._40_8_ = lVar19;
    pbStack_298 = pbVar12;
  }
  uVar5 = local_78._56_8_;
  iVar7 = 0;
  for (peVar17 = (element_type *)local_78._48_8_; peVar17 != (element_type *)uVar5;
      peVar17 = (element_type *)&(peVar17->m_data).benchmarkWarmupTime) {
    if (*(double *)&(peVar17->m_data).benchmarkSamples ==
        (peVar17->m_data).benchmarkConfidenceInterval) {
      iVar7 = -1;
      (**(code **)(*local_140 + 0x18))(local_140,peVar17);
    }
  }
  local_2c8._0_4_ = iVar7;
  pcVar3 = local_280[1]._M_dataplus._M_p;
  for (pcVar18 = *(pointer *)((long)&local_280->field_2 + 8); pcVar18 != pcVar3;
      pcVar18 = pcVar18 + 0x20) {
    (**(code **)(*local_140 + 0x20))(local_140,pcVar18);
  }
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_308);
  RunContext::testGroupEnded
            ((RunContext *)(local_278 + 0x10),(string *)local_308,(Totals *)local_2c8,1,1);
  pbVar12 = local_288;
  if ((pointer)local_308._0_8_ != (pointer)local_2f8) {
    operator_delete((void *)local_308._0_8_);
  }
  iVar8 = (*(((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)&pbVar12->_M_dataplus)->
             _M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
  iVar16 = 2;
  if (((byte)iVar8 & iVar7 == -1) == 0) {
    iVar8 = local_2c8._16_4_;
    if ((int)local_2c8._16_4_ <= iVar7) {
      iVar8 = local_2c8._0_4_;
    }
    iVar16 = 0xff;
    if (iVar8 < 0xff) {
      iVar16 = iVar8;
    }
  }
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          (local_78 + 0x30));
  clara::std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
               *)local_78);
  RunContext::~RunContext((RunContext *)(local_278 + 0x10));
  if ((pointer)local_278._8_8_ != (pointer)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  return iVar16;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return (std::min) (MaxExitCode, static_cast<int>(*listed));

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }